

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O2

void __thiscall ArgParser::ArgIterator::setcurrent(ArgIterator *this)

{
  size_t sVar1;
  char *pcVar2;
  
  this->longmatch = false;
  this->isoption = false;
  if (this->i == this->argc) {
    this->p = (char *)0x0;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = this->argv[this->i];
    this->p = pcVar2;
    sVar1 = stringlength<char>(pcVar2);
    pcVar2 = pcVar2 + sVar1;
  }
  this->pend = pcVar2;
  return;
}

Assistant:

void setcurrent()
        {
            longmatch = false;
            isoption = false;
            if (i==argc) {
                p = pend = nullptr;
                return;
            }
            p = argv[i];
            pend = p + stringlength(p);
        }